

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O1

TestRegistry * TestRegistry::getCurrentRegistry(void)

{
  int iVar1;
  TestRegistry *pTVar2;
  
  if (getCurrentRegistry()::registry == '\0') {
    iVar1 = __cxa_guard_acquire(&getCurrentRegistry()::registry);
    if (iVar1 != 0) {
      getCurrentRegistry::registry._vptr_TestRegistry = (_func_int **)&PTR__TestRegistry_002e8f28;
      getCurrentRegistry::registry.tests_ = (UtestShell *)0x0;
      getCurrentRegistry::registry.nameFilters_ = (TestFilter *)0x0;
      getCurrentRegistry::registry.groupFilters_ = (TestFilter *)0x0;
      getCurrentRegistry::registry.firstPlugin_ = &NullTestPlugin::instance()->super_TestPlugin;
      getCurrentRegistry::registry.runInSeperateProcess_ = false;
      getCurrentRegistry::registry.currentRepetition_ = 0;
      getCurrentRegistry::registry.runIgnored_ = false;
      __cxa_guard_release(&getCurrentRegistry()::registry);
    }
  }
  pTVar2 = &getCurrentRegistry::registry;
  if (currentRegistry_ != (TestRegistry *)0x0) {
    pTVar2 = currentRegistry_;
  }
  return pTVar2;
}

Assistant:

TestRegistry* TestRegistry::getCurrentRegistry()
{
    static TestRegistry registry;
    return (currentRegistry_ == NULLPTR) ? &registry : currentRegistry_;
}